

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

void __thiscall
Gudhi::Simplex_tree<Options_with_int_data>::rec_delete
          (Simplex_tree<Options_with_int_data> *this,Siblings *sib)

{
  Siblings *sib_00;
  stored_size_type sVar1;
  pointer ppVar2;
  pointer ppVar3;
  
  sVar1 = (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size;
  if (sVar1 != 0) {
    ppVar2 = (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
    ppVar3 = ppVar2;
    do {
      sib_00 = (ppVar3->second).children_;
      if (sib_00->parent_ == ppVar3->first) {
        rec_delete(this,sib_00);
        ppVar2 = (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
        sVar1 = (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size;
      }
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != ppVar2 + sVar1);
  }
  boost::container::
  vector<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>_>,_void>
  ::~vector((vector<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>_>,_void>
             *)&sib->members_);
  operator_delete(sib,0x28);
  return;
}

Assistant:

void rec_delete(Siblings * sib) {
    for (auto sh = sib->members().begin(); sh != sib->members().end(); ++sh) {
      if (has_children(sh)) {
        rec_delete(sh->second.children());
      }
    }
    delete sib;
  }